

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::mul<(moira::Instr)80>(Moira *this,u32 op1,u32 op2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  short in_DX;
  u16 in_SI;
  Moira *in_RDI;
  u32 result;
  
  uVar2 = (int)(short)in_SI * (int)in_DX;
  bVar1 = NBIT<(moira::Size)4>((ulong)uVar2);
  (in_RDI->reg).sr.n = bVar1;
  bVar1 = ZERO<(moira::Size)4>((ulong)uVar2);
  (in_RDI->reg).sr.z = bVar1;
  (in_RDI->reg).sr.v = false;
  (in_RDI->reg).sr.c = false;
  uVar3 = cyclesMul<(moira::Instr)80>(in_RDI,in_SI);
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,(ulong)uVar3);
  return uVar2;
}

Assistant:

u32
Moira::mul(u32 op1, u32 op2)
{
    u32 result;

    switch (I) {

         case MULS:
         {
             result = (i16)op1 * (i16)op2;
             break;
         }
         case MULU:
         {
             result = op1 * op2;
             break;
         }
        default: assert(false);
     }

    reg.sr.n = NBIT<Long>(result);
    reg.sr.z = ZERO<Long>(result);
    reg.sr.v = 0;
    reg.sr.c = 0;

    sync(cyclesMul<I>(op1));
    return result;
}